

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::processLoggingMessage(FederateState *this,ActionMessage *cmd)

{
  SmallBuffer *this_00;
  action_t aVar1;
  string *psVar2;
  _Alloc_hider _Var3;
  int level;
  size_t sVar5;
  bool bVar7;
  string_view data;
  string_view data_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view logMessageSource;
  string_view query;
  string_view logMessageSource_00;
  string_view message;
  string_view message_00;
  string qres;
  size_type sVar4;
  byte *pbVar6;
  
  aVar1 = cmd->messageAction;
  if (aVar1 != cmd_log) {
    if (aVar1 == cmd_set_profiler_flag) {
      setOptionFlag(this,0x5d,SUB41((cmd->flags & 0x20) >> 5,0));
      return;
    }
    if (aVar1 == cmd_timeout_disconnect) {
      query._M_str = "global_time_debugging";
      query._M_len = 0x15;
      processQueryActual_abi_cxx11_(&qres,this,query);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qres,0,
                 "TIME DEBUGGING::");
      logMessageSource_00._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      logMessageSource_00._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      message_00._M_str = qres._M_dataplus._M_p;
      message_00._M_len = qres._M_string_length;
      logMessage(this,3,logMessageSource_00,message_00,false);
      std::__cxx11::string::~string((string *)&qres);
      return;
    }
    if (aVar1 == cmd_warning) {
      if ((cmd->payload).bufferSize == 0) {
        this_00 = &cmd->payload;
        qres._M_dataplus._M_p = commandErrorString(0);
        SmallBuffer::operator=(this_00,(char **)&qres);
        __x._M_str = (char *)(cmd->payload).heap;
        __x._M_len = (cmd->payload).bufferSize;
        __y._M_str = "unknown";
        __y._M_len = 7;
        bVar7 = std::operator==(__x,__y);
        if (bVar7) {
          data._M_str = " code:";
          data._M_len = 6;
          SmallBuffer::append(this_00,data);
          CLI::std::__cxx11::to_string((string *)&qres,cmd->messageID);
          data_00._M_str = qres._M_dataplus._M_p;
          data_00._M_len = qres._M_string_length;
          SmallBuffer::append(this_00,data_00);
          std::__cxx11::string::~string((string *)&qres);
        }
      }
      sVar5 = (cmd->payload).bufferSize;
      pbVar6 = (cmd->payload).heap;
      bVar7 = false;
      level = 3;
      _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      goto LAB_002a2f89;
    }
    if (aVar1 != cmd_remote_log) {
      return;
    }
  }
  level = cmd->messageID;
  psVar2 = ActionMessage::getString_abi_cxx11_(cmd,0);
  pbVar6 = (cmd->payload).heap;
  sVar5 = (cmd->payload).bufferSize;
  bVar7 = cmd->messageAction == cmd_remote_log;
  _Var3._M_p = (psVar2->_M_dataplus)._M_p;
  sVar4 = psVar2->_M_string_length;
LAB_002a2f89:
  logMessageSource._M_str = _Var3._M_p;
  logMessageSource._M_len = sVar4;
  message._M_str = (char *)pbVar6;
  message._M_len = sVar5;
  logMessage(this,level,logMessageSource,message,bVar7);
  return;
}

Assistant:

void FederateState::processLoggingMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_LOG:
        case CMD_REMOTE_LOG:
            logMessage(cmd.messageID,
                       cmd.getString(0),
                       cmd.payload.to_string(),
                       cmd.action() == CMD_REMOTE_LOG);
            break;

        case CMD_WARNING:
            if (cmd.payload.empty()) {
                cmd.payload = commandErrorString(cmd.messageID);
                if (cmd.payload.to_string() == "unknown") {
                    cmd.payload.append(" code:");
                    cmd.payload.append(std::to_string(cmd.messageID));
                }
            }
            LOG_WARNING(cmd.payload.to_string());
            break;
        case CMD_SET_PROFILER_FLAG:
            setOptionFlag(defs::PROFILING, checkActionFlag(cmd, indicator_flag));
            break;
        case CMD_TIMEOUT_DISCONNECT: {
            auto qres = processQueryActual("global_time_debugging");
            qres.insert(0, "TIME DEBUGGING::");
            LOG_WARNING(qres);
        } break;
        default:
            break;
    }
}